

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNStm * __thiscall CTcParser::parse_throw(CTcParser *this,int *err)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  CTPNStmBase *this_00;
  int *siz;
  
  siz = err;
  CTcTokenizer::next(G_tok);
  pCVar2 = parse_expr(this);
  if (pCVar2 != (CTcPrsNode *)0x0) {
    this_00 = (CTPNStmBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)siz);
    CTPNStmBase::CTPNStmBase(this_00);
    this_00[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar2;
    (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_0031b700;
    iVar1 = parse_req_sem();
    if (iVar1 == 0) {
      return (CTPNStm *)this_00;
    }
  }
  *err = 1;
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_throw(int *err)
{
    CTcPrsNode *expr;
    CTPNStmThrow *throw_stm;
    
    /* skip the 'throw' keyword */
    G_tok->next();

    /* parse the expression to be thrown */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* create the statement node */
    throw_stm = new CTPNStmThrow(expr);

    /* require a terminating semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the statement node */
    return throw_stm;
}